

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildDescription.cpp
# Opt level: O2

Tool * __thiscall
llbuild::buildsystem::BuildDescription::addTool
          (BuildDescription *this,
          unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>
          *value)

{
  Tool *pTVar1;
  StringRef Key;
  __uniq_ptr_impl<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>
  *this_00;
  
  pTVar1 = (value->_M_t).
           super___uniq_ptr_impl<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>
           ._M_t.
           super__Tuple_impl<0UL,_llbuild::buildsystem::Tool_*,_std::default_delete<llbuild::buildsystem::Tool>_>
           .super__Head_base<0UL,_llbuild::buildsystem::Tool_*,_false>._M_head_impl;
  Key.Data = (pTVar1->name)._M_dataplus._M_p;
  Key.Length = (pTVar1->name)._M_string_length;
  this_00 = (__uniq_ptr_impl<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>
             *)llvm::
               StringMap<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>,_llvm::MallocAllocator>
               ::operator[](&this->tools,Key);
  std::__uniq_ptr_impl<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>
  ::operator=(this_00,(__uniq_ptr_impl<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>
                       *)value);
  return pTVar1;
}

Assistant:

Tool& BuildDescription::addTool(std::unique_ptr<Tool> value) {
  auto& result = *value.get();
  getTools()[value->getName()] = std::move(value);
  return result;
}